

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZGeoElSidePartition>::Resize
          (TPZVec<TPZGeoElSidePartition> *this,int64_t newsize,TPZGeoElSidePartition *object)

{
  undefined8 *puVar1;
  TPZGeoElSidePartition *pTVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  int64_t *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  TPZGeoElSidePartition *pTVar10;
  TPZVec<TPZGeoElSidePartition> *pTVar11;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar8 = this->fNElements;
  if (lVar8 != newsize) {
    if (newsize == 0) {
      pTVar10 = (TPZGeoElSidePartition *)0x0;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = newsize;
      uVar4 = SUB168(auVar3 * ZEXT816(0x38),0);
      uVar5 = uVar4 + 8;
      if (0xfffffffffffffff7 < uVar4) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar4 = 0xffffffffffffffff;
      if (SUB168(auVar3 * ZEXT816(0x38),8) == 0) {
        uVar4 = uVar5;
      }
      piVar6 = (int64_t *)operator_new__(uVar4);
      *piVar6 = newsize;
      pTVar10 = (TPZGeoElSidePartition *)(piVar6 + 1);
      lVar9 = 0;
      do {
        *(undefined ***)((long)piVar6 + lVar9 + 8) = &PTR__TPZGeoElSide_01920090;
        *(undefined8 *)((long)piVar6 + lVar9 + 0x10) = 0;
        *(undefined4 *)((long)piVar6 + lVar9 + 0x18) = 0xffffffff;
        *(undefined ***)((long)piVar6 + lVar9 + 0x20) = &PTR__TPZVec_01920ce0;
        puVar1 = (undefined8 *)((long)piVar6 + lVar9 + 0x28);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)piVar6 + lVar9 + 0x38) = 0;
        lVar9 = lVar9 + 0x38;
      } while (newsize * 0x38 - lVar9 != 0);
    }
    if (newsize <= lVar8) {
      lVar8 = newsize;
    }
    if (lVar8 < 1) {
      lVar9 = 0;
    }
    else {
      lVar7 = 0x18;
      lVar9 = 0;
      pTVar2 = pTVar10;
      do {
        pTVar11 = &pTVar2->fPartition;
        pTVar2 = this->fStore;
        *(undefined4 *)((long)(pTVar11 + -1) + 0x18) = *(undefined4 *)((long)pTVar2 + lVar7 + -8);
        *(undefined8 *)((long)(pTVar11 + -1) + 0x10) = *(undefined8 *)((long)pTVar2 + lVar7 + -0x10)
        ;
        operator=(pTVar11,(TPZVec<TPZGeoElSidePartition> *)
                          ((long)&(pTVar2->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar7));
        lVar9 = lVar9 + 1;
        pTVar2 = (TPZGeoElSidePartition *)(pTVar11 + 1);
        lVar7 = lVar7 + 0x38;
      } while (lVar8 != lVar9);
    }
    lVar8 = newsize - lVar9;
    if (lVar8 != 0 && lVar9 <= newsize) {
      pTVar2 = pTVar10 + lVar9;
      do {
        pTVar11 = &pTVar2->fPartition;
        *(int *)((long)(pTVar11 + -1) + 0x18) = (object->fCurrent).fSide;
        *(TPZGeoEl **)((long)(pTVar11 + -1) + 0x10) = (object->fCurrent).fGeoEl;
        operator=(pTVar11,&object->fPartition);
        pTVar2 = (TPZGeoElSidePartition *)(pTVar11 + 1);
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pTVar2 = this->fStore;
    if (pTVar2 != (TPZGeoElSidePartition *)0x0) {
      lVar8 = pTVar2[-1].fPartition.fNAlloc;
      if (lVar8 != 0) {
        lVar9 = lVar8 * 0x38;
        do {
          TPZGeoElSidePartition::~TPZGeoElSidePartition
                    ((TPZGeoElSidePartition *)
                     ((long)&pTVar2[-1].fCurrent.super_TPZSavable._vptr_TPZSavable + lVar9));
          lVar9 = lVar9 + -0x38;
        } while (lVar9 != 0);
      }
      operator_delete__(&pTVar2[-1].fPartition.fNAlloc,lVar8 * 0x38 + 8);
      this->fStore = (TPZGeoElSidePartition *)0x0;
    }
    this->fStore = pTVar10;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}